

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)6>_>
          (xpath_ast_node *this,xml_node_struct *ns,long *xn,undefined8 param_4,byte once)

{
  bool bVar1;
  xpath_allocator *pxVar2;
  xpath_allocator *pxVar3;
  
  pxVar2 = (xpath_allocator *)*xn;
  if (pxVar2 == (xpath_allocator *)0x0 || xn[1] != 0) {
    if (pxVar2 != (xpath_allocator *)0x0 && xn[1] != 0) {
      do {
        pxVar3 = (xpath_allocator *)pxVar2[1]._root_size;
        if ((xpath_allocator *)pxVar2[1]._root_size == (xpath_allocator *)0x0) {
          while (pxVar3 = (xpath_allocator *)pxVar2[2]._root,
                (xpath_allocator *)pxVar2[2]._root == (xpath_allocator *)0x0) {
            pxVar2 = (xpath_allocator *)pxVar2[1]._root;
            if (pxVar2 == (xpath_allocator *)0x0) {
              return;
            }
          }
        }
        pxVar2 = pxVar3;
        bVar1 = step_push((xpath_ast_node *)(ulong)(byte)this->_test,
                          (xpath_node_set_raw *)(this->_data).variable,ns,pxVar2);
      } while ((bVar1 & once) != 1);
    }
  }
  else {
    do {
      pxVar3 = (xpath_allocator *)pxVar2[2]._root;
      if (pxVar3 != (xpath_allocator *)0x0) {
        bVar1 = step_push((xpath_ast_node *)(ulong)(byte)this->_test,
                          (xpath_node_set_raw *)(this->_data).variable,ns,pxVar3);
        do {
          if ((bVar1 & once) != 0) {
            return;
          }
          pxVar2 = (xpath_allocator *)pxVar3[1]._root_size;
          if (pxVar2 == (xpath_allocator *)0x0) {
            while (pxVar2 = (xpath_allocator *)pxVar3[2]._root, pxVar2 == (xpath_allocator *)0x0) {
              pxVar3 = (xpath_allocator *)pxVar3[1]._root;
              if (pxVar3 == (xpath_allocator *)0x0) {
                return;
              }
            }
          }
          bVar1 = step_push((xpath_ast_node *)(ulong)(byte)this->_test,
                            (xpath_node_set_raw *)(this->_data).variable,ns,pxVar2);
          pxVar3 = pxVar2;
        } while( true );
      }
      pxVar2 = (xpath_allocator *)pxVar2[1]._root;
    } while (pxVar2 != (xpath_allocator *)0x0);
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}